

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESoinn.cpp
# Opt level: O2

void __thiscall
nn::ESoinn::trainOneEpoch
          (ESoinn *this,
          vector<std::shared_ptr<wv::AbstractWeightVector>,_std::allocator<std::shared_ptr<wv::AbstractWeightVector>_>_>
          *points,bool train_first_layer,double threshold_second_layer,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *labels)

{
  Point *p;
  pointer pbVar1;
  ConcreteLogger *pCVar2;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  uint uVar4;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  string local_c8;
  unsigned_long local_a8;
  string_type local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_80;
  double local_78;
  vector<std::shared_ptr<wv::AbstractWeightVector>,_std::allocator<std::shared_ptr<wv::AbstractWeightVector>_>_>
  *local_70;
  undefined1 auStack_68 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> order;
  allocator local_35;
  uint local_34 [2];
  uint32_t iteration;
  
  pCVar2 = log_netw;
  local_80 = labels;
  local_78 = threshold_second_layer;
  std::__cxx11::string::string((string *)&local_1a8,"trainOneEpoch function",(allocator *)&local_a0)
  ;
  logger::ConcreteLogger::debug(pCVar2,(string *)&local_1a8,false);
  std::__cxx11::string::~string((string *)&local_1a8);
  auStack_68 = (undefined1  [8])0x0;
  order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (local_1a8.items_.
       super__Vector_base<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
      (ulong)(uint)local_1a8.items_.
                   super__Vector_base<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start <
      (ulong)((long)(points->
                    super__Vector_base<std::shared_ptr<wv::AbstractWeightVector>,_std::allocator<std::shared_ptr<wv::AbstractWeightVector>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(points->
                    super__Vector_base<std::shared_ptr<wv::AbstractWeightVector>,_std::allocator<std::shared_ptr<wv::AbstractWeightVector>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4);
      local_1a8.items_.
      super__Vector_base<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ =
           (uint)local_1a8.items_.
                 super__Vector_base<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_68,
               (value_type_conflict3 *)&local_1a8);
  }
  local_70 = points;
  std::
  random_shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )auStack_68,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start);
  local_34[0] = 1;
  uVar4 = 0;
  while( true ) {
    if ((ulong)((long)order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start - (long)auStack_68 >> 2) <= (ulong)uVar4)
    break;
    p = (local_70->
        super__Vector_base<std::shared_ptr<wv::AbstractWeightVector>,_std::allocator<std::shared_ptr<wv::AbstractWeightVector>_>_>
        )._M_impl.super__Vector_impl_data._M_start[*(uint *)((long)auStack_68 + (ulong)uVar4 * 4)].
        super___shared_ptr<wv::AbstractWeightVector,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pbVar1 = (local_80->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (pbVar1 == (local_80->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string((string *)&local_c8,"0",&local_35);
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_c8,
                 (string *)(pbVar1 + *(uint *)((long)auStack_68 + (ulong)uVar4 * 4)));
    }
    processNewPoint(this,p,&local_c8,train_first_layer,local_78);
    std::__cxx11::string::~string((string *)&local_c8);
    pCVar2 = log_netw;
    if (local_34[0] % this->m_Lambda == 0) {
      std::__cxx11::string::string
                ((string *)&local_1a8,"iteration multiple lambda",(allocator *)&local_a0);
      logger::ConcreteLogger::debug(pCVar2,(string *)&local_1a8,false);
      std::__cxx11::string::~string((string *)&local_1a8);
      updateClassLabels(this);
      deleteEdgesDiffClasses(this);
      deleteNodes(this);
    }
    pCVar2 = log_netw;
    if (local_34[0] % 10000 == 0) {
      boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                (&local_1a8,"Iteration %d");
      pbVar3 = boost::io::detail::
               feed<char,std::char_traits<char>,std::allocator<char>,unsigned_int&>
                         (&local_1a8,local_34);
      boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
                (&local_a0,pbVar3);
      logger::ConcreteLogger::info(pCVar2,&local_a0,false);
      std::__cxx11::string::~string((string *)&local_a0);
      boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format
                (&local_1a8);
    }
    local_34[0] = local_34[0] + 1;
    uVar4 = uVar4 + 1;
  }
  deleteNodes(this);
  SealNeuronVector(this);
  pCVar2 = log_netw;
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (&local_1a8,"Network size = %d, number of empty neurons = %d");
  local_a8 = ((long)(this->m_Neurons).
                    super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_Neurons).
                   super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x88;
  pbVar3 = boost::io::detail::
           feed<char,std::char_traits<char>,std::allocator<char>,unsigned_long_const&>
                     (&local_1a8,&local_a8);
  pbVar3 = boost::io::detail::feed<char,std::char_traits<char>,std::allocator<char>,unsigned_int&>
                     (pbVar3,&this->m_NumEmptyNeurons);
  boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
            (&local_a0,pbVar3);
  logger::ConcreteLogger::info(pCVar2,&local_a0,false);
  std::__cxx11::string::~string((string *)&local_a0);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format
            (&local_1a8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_68);
  return;
}

Assistant:

void ESoinn::trainOneEpoch(const std::vector<std::shared_ptr<wv::Point>>& points, bool train_first_layer, double threshold_second_layer, const std::vector<std::string>& labels)
    {
        log_netw->debug("trainOneEpoch function");
        //create vector with order of iterating by points
        std::vector<uint32_t> order;
        for (uint32_t i = 0; i < points.size(); i++)
            order.push_back(i);
        
        std::random_shuffle(order.begin(), order.end());
        uint32_t iteration = 1;

        for (uint32_t i = 0; i < order.size(); i++)
        {
            processNewPoint(points[order[i]].get(), (labels.empty()) ? "0" : labels[order[i]], train_first_layer, threshold_second_layer);
            if (iteration % m_Lambda == 0)
            {
                log_netw->debug("iteration multiple lambda");
                updateClassLabels();
                deleteEdgesDiffClasses();
                deleteNodes();
            }
            if (iteration % 10000 == 0)
                log_netw->info((boost::format("Iteration %d") % iteration).str());
            iteration++;
        }
        deleteNodes();
        SealNeuronVector();
        
        log_netw->info((boost::format("Network size = %d, number of empty neurons = %d") % m_Neurons.size() % m_NumEmptyNeurons).str());
    }